

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

int qstrnicmp(char *str1,qsizetype len1,char *str2,qsizetype len2)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (str1 == (char *)0x0 || len1 == 0) {
    iVar2 = 0;
    if (len2 != 0) {
      if (len2 == -1) {
        if (str2 != (char *)0x0) {
          cVar1 = *str2;
LAB_002d060f:
          iVar2 = -(uint)(cVar1 != '\0');
        }
      }
      else {
        iVar2 = -1;
      }
    }
  }
  else {
    iVar2 = 1;
    if (str2 != (char *)0x0) {
      if (len2 == -1) {
        lVar4 = 0;
        if (len1 < 1) {
          len1 = lVar4;
        }
        do {
          if (len1 == lVar4) {
            cVar1 = str2[len1];
            goto LAB_002d060f;
          }
          if (str2[lVar4] == '\0') {
            return 1;
          }
          iVar2 = QtMiscUtils::caseCompareAscii(str1[lVar4],str2[lVar4]);
          lVar4 = lVar4 + 1;
        } while (iVar2 == 0);
      }
      else {
        lVar4 = len2;
        if (len1 < len2) {
          lVar4 = len1;
        }
        lVar3 = 0;
        if (lVar4 < 1) {
          lVar4 = lVar3;
        }
        do {
          if (lVar4 == lVar3) {
            if (len1 != len2) {
              return ((len2 <= len1) - 1) + (uint)(len2 <= len1);
            }
            return 0;
          }
          iVar2 = QtMiscUtils::caseCompareAscii(str1[lVar3],str2[lVar3]);
          lVar3 = lVar3 + 1;
        } while (iVar2 == 0);
      }
    }
  }
  return iVar2;
}

Assistant:

int qstrnicmp(const char *str1, qsizetype len1, const char *str2, qsizetype len2)
{
    Q_ASSERT(len1 >= 0);
    Q_ASSERT(len2 >= -1);
    const uchar *s1 = reinterpret_cast<const uchar *>(str1);
    const uchar *s2 = reinterpret_cast<const uchar *>(str2);
    if (!s1 || !len1) {
        if (len2 == 0)
            return 0;
        if (len2 == -1)
            return (!s2 || !*s2) ? 0 : -1;
        Q_ASSERT(s2);
        return -1;
    }
    if (!s2)
        return len1 == 0 ? 0 : 1;

    if (len2 == -1) {
        // null-terminated str2
        qsizetype i;
        for (i = 0; i < len1; ++i) {
            const uchar c = s2[i];
            if (!c)
                return 1;

            if (int res = QtMiscUtils::caseCompareAscii(s1[i], c))
                return res;
        }
        return s2[i] ? -1 : 0;
    } else {
        // not null-terminated
        const qsizetype len = qMin(len1, len2);
        for (qsizetype i = 0; i < len; ++i) {
            if (int res = QtMiscUtils::caseCompareAscii(s1[i], s2[i]))
                return res;
        }
        if (len1 == len2)
            return 0;
        return len1 < len2 ? -1 : 1;
    }
}